

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsymtab.c
# Opt level: O0

D_Sym * next_D_Sym_in_Scope(D_Scope **scope,D_Sym **sym)

{
  uint local_38;
  D_Scope *pDStack_30;
  uint i;
  D_Scope *st;
  D_Sym *ll;
  D_Sym *last_sym;
  D_Sym **sym_local;
  D_Scope **scope_local;
  
  ll = *sym;
  pDStack_30 = *scope;
  st = (D_Scope *)ll;
  if (((D_Scope *)ll == (D_Scope *)0x0) || (st = ((D_Scope *)ll)->search, st == (D_Scope *)0x0)) {
    for (; pDStack_30 != (D_Scope *)0x0; pDStack_30 = pDStack_30->search) {
      if (pDStack_30->hash == (D_SymHash *)0x0) {
        if (ll == (D_Sym *)0x0) {
          st = (D_Scope *)pDStack_30->ll;
        }
      }
      else {
        if (ll == (D_Sym *)0x0) {
          local_38 = 0;
        }
        else {
          local_38 = (ll->hash + 1) % (pDStack_30->hash->syms).n;
          if (local_38 == 0) goto LAB_0015ad9e;
        }
        st = (D_Scope *)(pDStack_30->hash->syms).v[local_38];
      }
LAB_0015ad9e:
      ll = (D_Sym *)0x0;
      if (((st != (D_Scope *)0x0) || (pDStack_30->search == (D_Scope *)0x0)) ||
         (pDStack_30->search->up != pDStack_30->up)) break;
    }
  }
  if (st != (D_Scope *)0x0) {
    *sym = (D_Sym *)st;
  }
  *scope = pDStack_30;
  return (D_Sym *)st;
}

Assistant:

D_Sym *next_D_Sym_in_Scope(D_Scope **scope, D_Sym **sym) {
  D_Sym *last_sym = *sym, *ll = last_sym;
  D_Scope *st = *scope;
  if (ll) {
    ll = ll->next;
    if (ll) goto Lreturn;
  }
  for (; st; st = st->search) {
    if (st->hash) {
      uint i = last_sym ? ((last_sym->hash + 1) % st->hash->syms.n) : 0;
      if (!last_sym || i) ll = st->hash->syms.v[i];
    } else {
      if (!last_sym) ll = st->ll;
    }
    last_sym = 0;
    if (ll) goto Lreturn;
    if (!st->search || st->search->up != st->up) break;
  }
Lreturn:
  if (ll) *sym = ll;
  *scope = st;
  return ll;
}